

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.hpp
# Opt level: O1

bool __thiscall
Inferences::OverlayBinder::tryGetBinding(OverlayBinder *this,Var var,TermList *result)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->m_base)._M_h._M_bucket_count;
  uVar3 = (ulong)var % uVar1;
  p_Var5 = (this->m_base)._M_h._M_buckets[uVar3];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(Var *)&p_Var5->_M_nxt[1]._M_nxt != var)) {
    while (p_Var5 = p_Var4, p_Var4 = p_Var5->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var4[1]._M_nxt == var)) goto LAB_004bb6ed;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_004bb6ed:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var6->_M_nxt;
  }
  bVar2 = true;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    uVar1 = (this->m_overlay)._M_h._M_bucket_count;
    uVar3 = (ulong)var % uVar1;
    p_Var5 = (this->m_overlay)._M_h._M_buckets[uVar3];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(Var *)&p_Var5->_M_nxt[1]._M_nxt != var)) {
      while (p_Var5 = p_Var4, p_Var4 = p_Var5->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar1 != uVar3) ||
           (p_Var6 = p_Var5, *(uint *)&p_Var4[1]._M_nxt == var)) goto LAB_004bb75a;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_004bb75a:
    if (p_Var6 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var6->_M_nxt;
    }
    bVar2 = p_Var4 != (_Hash_node_base *)0x0;
    if (p_Var4 == (_Hash_node_base *)0x0) {
      return bVar2;
    }
  }
  result->_content = (uint64_t)p_Var4[2]._M_nxt;
  return bVar2;
}

Assistant:

bool tryGetBinding(Var var, TermList& result) const
    {
      auto b_it = m_base.find(var);
      if (b_it != m_base.end()) {
        // var has base binding
        result = b_it->second;
        return true;
      } else {
        auto o_it = m_overlay.find(var);
        if (o_it != m_overlay.end()) {
          // var has overlay binding
          result = o_it->second;
          return true;
        } else {
          // var is unbound
          return false;
        }
      }
    }